

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  undefined4 uVar1;
  long *plVar2;
  undefined4 *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  byte *pbVar11;
  long in_RDI;
  bool bVar12;
  mz_uint32 t_2;
  mz_uint32 t_1;
  int root_1;
  int child_1;
  mz_uint32 t;
  int root;
  int child;
  int end;
  int start;
  int size;
  mz_uint32 *pIndices;
  mz_zip_array *pCentral_dir;
  mz_zip_array *pCentral_dir_offsets;
  mz_zip_internal_state *pState;
  mz_uint8 r_3;
  mz_uint8 l_3;
  mz_uint r_len_3;
  mz_uint l_len_3;
  mz_uint8 *pR_3;
  mz_uint8 *pE_3;
  mz_uint8 *pL_3;
  mz_uint8 r_2;
  mz_uint8 l_2;
  mz_uint r_len_2;
  mz_uint l_len_2;
  mz_uint8 *pR_2;
  mz_uint8 *pE_2;
  mz_uint8 *pL_2;
  mz_uint8 r_1;
  mz_uint8 l_1;
  mz_uint r_len_1;
  mz_uint l_len_1;
  mz_uint8 *pR_1;
  mz_uint8 *pE_1;
  mz_uint8 *pL_1;
  mz_uint8 r;
  mz_uint8 l;
  mz_uint r_len;
  mz_uint l_len;
  mz_uint8 *pR;
  mz_uint8 *pE;
  mz_uint8 *pL;
  uint local_1c4;
  uint local_1a4;
  bool local_192;
  uint local_184;
  uint local_164;
  bool local_151;
  int local_148;
  int local_13c;
  int local_134;
  int local_130;
  byte local_fa;
  byte local_f9;
  byte *local_f0;
  byte *local_e0;
  byte local_ba;
  byte local_b9;
  byte *local_b0;
  byte *local_a0;
  byte local_7a;
  byte local_79;
  byte *local_70;
  byte *local_60;
  byte local_3a;
  byte local_39;
  byte *local_30;
  byte *local_20;
  
  plVar2 = *(long **)(in_RDI + 0x58);
  plVar8 = plVar2 + 4;
  puVar3 = (undefined4 *)plVar2[8];
  local_134 = *(int *)(in_RDI + 0x10);
  local_130 = local_134 + -2 >> 1;
  do {
    if (local_130 < 0) {
      do {
        local_134 = local_134 + -1;
        if (local_134 < 1) {
          return;
        }
        local_148 = 0;
        uVar1 = puVar3[local_134];
        puVar3[local_134] = *puVar3;
        *puVar3 = uVar1;
        while( true ) {
          iVar4 = local_148 * 2;
          iVar5 = iVar4 + 1;
          if (local_134 <= iVar5) break;
          local_192 = false;
          if (iVar4 + 2 < local_134) {
            lVar9 = *plVar2 + (ulong)*(uint *)(*plVar8 + (ulong)(uint)puVar3[iVar5] * 4);
            lVar10 = *plVar2 + (ulong)*(uint *)(*plVar8 + (ulong)(uint)puVar3[iVar4 + 2] * 4);
            uVar6 = (uint)*(ushort *)(lVar9 + 0x1c);
            uVar7 = (uint)*(ushort *)(lVar10 + 0x1c);
            local_b9 = 0;
            local_ba = 0;
            local_a0 = (byte *)(lVar9 + 0x2e);
            local_b0 = (byte *)(lVar10 + 0x2e);
            local_1a4 = uVar7;
            if (uVar6 < uVar7) {
              local_1a4 = uVar6;
            }
            pbVar11 = local_a0 + local_1a4;
            for (; local_a0 < pbVar11; local_a0 = local_a0 + 1) {
              if ((*local_a0 < 0x41) || (0x5a < *local_a0)) {
                local_b9 = *local_a0;
              }
              else {
                local_b9 = *local_a0 + 0x20;
              }
              if ((*local_b0 < 0x41) || (0x5a < *local_b0)) {
                local_ba = *local_b0;
              }
              else {
                local_ba = *local_b0 + 0x20;
              }
              if (local_b9 != local_ba) break;
              local_b0 = local_b0 + 1;
            }
            if (local_a0 == pbVar11) {
              local_192 = uVar6 < uVar7;
            }
            else {
              local_192 = local_b9 < local_ba;
            }
          }
          iVar5 = (uint)local_192 + iVar5;
          lVar9 = *plVar2 + (ulong)*(uint *)(*plVar8 + (ulong)(uint)puVar3[local_148] * 4);
          lVar10 = *plVar2 + (ulong)*(uint *)(*plVar8 + (ulong)(uint)puVar3[iVar5] * 4);
          uVar6 = (uint)*(ushort *)(lVar9 + 0x1c);
          uVar7 = (uint)*(ushort *)(lVar10 + 0x1c);
          local_f9 = 0;
          local_fa = 0;
          local_e0 = (byte *)(lVar9 + 0x2e);
          local_f0 = (byte *)(lVar10 + 0x2e);
          local_1c4 = uVar7;
          if (uVar6 < uVar7) {
            local_1c4 = uVar6;
          }
          pbVar11 = local_e0 + local_1c4;
          for (; local_e0 < pbVar11; local_e0 = local_e0 + 1) {
            if ((*local_e0 < 0x41) || (0x5a < *local_e0)) {
              local_f9 = *local_e0;
            }
            else {
              local_f9 = *local_e0 + 0x20;
            }
            if ((*local_f0 < 0x41) || (0x5a < *local_f0)) {
              local_fa = *local_f0;
            }
            else {
              local_fa = *local_f0 + 0x20;
            }
            if (local_f9 != local_fa) break;
            local_f0 = local_f0 + 1;
          }
          if (local_e0 == pbVar11) {
            bVar12 = uVar6 < uVar7;
          }
          else {
            bVar12 = local_f9 < local_fa;
          }
          if (!bVar12) break;
          uVar1 = puVar3[local_148];
          puVar3[local_148] = puVar3[iVar5];
          puVar3[iVar5] = uVar1;
          local_148 = iVar5;
        }
      } while( true );
    }
    local_13c = local_130;
    while( true ) {
      iVar4 = local_13c * 2;
      iVar5 = iVar4 + 1;
      if (local_134 <= iVar5) break;
      local_151 = false;
      if (iVar4 + 2 < local_134) {
        lVar9 = *plVar2 + (ulong)*(uint *)(*plVar8 + (ulong)(uint)puVar3[iVar5] * 4);
        lVar10 = *plVar2 + (ulong)*(uint *)(*plVar8 + (ulong)(uint)puVar3[iVar4 + 2] * 4);
        uVar6 = (uint)*(ushort *)(lVar9 + 0x1c);
        uVar7 = (uint)*(ushort *)(lVar10 + 0x1c);
        local_39 = 0;
        local_3a = 0;
        local_20 = (byte *)(lVar9 + 0x2e);
        local_30 = (byte *)(lVar10 + 0x2e);
        local_164 = uVar7;
        if (uVar6 < uVar7) {
          local_164 = uVar6;
        }
        pbVar11 = local_20 + local_164;
        for (; local_20 < pbVar11; local_20 = local_20 + 1) {
          if ((*local_20 < 0x41) || (0x5a < *local_20)) {
            local_39 = *local_20;
          }
          else {
            local_39 = *local_20 + 0x20;
          }
          if ((*local_30 < 0x41) || (0x5a < *local_30)) {
            local_3a = *local_30;
          }
          else {
            local_3a = *local_30 + 0x20;
          }
          if (local_39 != local_3a) break;
          local_30 = local_30 + 1;
        }
        if (local_20 == pbVar11) {
          local_151 = uVar6 < uVar7;
        }
        else {
          local_151 = local_39 < local_3a;
        }
      }
      iVar5 = (uint)local_151 + iVar5;
      lVar9 = *plVar2 + (ulong)*(uint *)(*plVar8 + (ulong)(uint)puVar3[local_13c] * 4);
      lVar10 = *plVar2 + (ulong)*(uint *)(*plVar8 + (ulong)(uint)puVar3[iVar5] * 4);
      uVar6 = (uint)*(ushort *)(lVar9 + 0x1c);
      uVar7 = (uint)*(ushort *)(lVar10 + 0x1c);
      local_79 = 0;
      local_7a = 0;
      local_60 = (byte *)(lVar9 + 0x2e);
      local_70 = (byte *)(lVar10 + 0x2e);
      local_184 = uVar7;
      if (uVar6 < uVar7) {
        local_184 = uVar6;
      }
      pbVar11 = local_60 + local_184;
      for (; local_60 < pbVar11; local_60 = local_60 + 1) {
        if ((*local_60 < 0x41) || (0x5a < *local_60)) {
          local_79 = *local_60;
        }
        else {
          local_79 = *local_60 + 0x20;
        }
        if ((*local_70 < 0x41) || (0x5a < *local_70)) {
          local_7a = *local_70;
        }
        else {
          local_7a = *local_70 + 0x20;
        }
        if (local_79 != local_7a) break;
        local_70 = local_70 + 1;
      }
      if (local_60 == pbVar11) {
        bVar12 = uVar6 < uVar7;
      }
      else {
        bVar12 = local_79 < local_7a;
      }
      if (!bVar12) break;
      uVar1 = puVar3[local_13c];
      puVar3[local_13c] = puVar3[iVar5];
      puVar3[iVar5] = uVar1;
      local_13c = iVar5;
    }
    local_130 = local_130 + -1;
  } while( true );
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)
{
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  int start = (size - 2) >> 1, end;
  while (start >= 0)
  {
    int child, root = start;
    for ( ; ; )
    {
      if ((child = (root << 1) + 1) >= size)
        break;
      child += (((child + 1) < size) && (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1])));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]); root = child;
    }
    start--;
  }

  end = size - 1;
  while (end > 0)
  {
    int child, root = 0;
    MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
    for ( ; ; )
    {
      if ((child = (root << 1) + 1) >= end)
        break;
      child += (((child + 1) < end) && mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1]));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]); root = child;
    }
    end--;
  }
}